

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O1

bool __thiscall
LZ77Compressor::search
          (LZ77Compressor *this,uint8_t *bytes,int srcOffset,int maxLen,int *matchOff,int *matchLen)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  
  uVar4 = (ulong)bytes[(long)srcOffset + 2] << 2 ^
          (ulong)((uint)bytes[(long)srcOffset + 1] * 2) ^ (ulong)bytes[srcOffset];
  *matchOff = -1;
  *matchLen = 2;
  piVar5 = this->dict[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = this->dict[uVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar5 != piVar2) {
    do {
      iVar1 = *piVar5;
      if (srcOffset < iVar1 + maxLen) {
        if (maxLen < 1) goto LAB_001098e1;
        uVar4 = 0;
        iVar3 = iVar1;
        do {
          if (srcOffset <= iVar3) {
            iVar3 = iVar1;
          }
          if (bytes[iVar3] != bytes[uVar4 + (long)srcOffset]) goto LAB_001098e4;
          uVar4 = uVar4 + 1;
          iVar3 = iVar3 + 1;
        } while ((uint)maxLen != uVar4);
LAB_001098dc:
        uVar4 = (ulong)(uint)maxLen;
      }
      else {
        if (0 < maxLen) {
          uVar4 = 0;
          do {
            if (bytes[uVar4 + (long)iVar1] != bytes[uVar4 + (long)srcOffset]) goto LAB_001098e4;
            uVar4 = uVar4 + 1;
          } while ((uint)maxLen != uVar4);
          goto LAB_001098dc;
        }
LAB_001098e1:
        uVar4 = 0;
      }
LAB_001098e4:
      iVar3 = (int)uVar4;
      if (*matchLen < iVar3) {
        *matchOff = iVar1;
        *matchLen = iVar3;
        if (iVar3 == maxLen) break;
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar2);
  }
  return 2 < *matchLen;
}

Assistant:

bool search(const uint8_t* bytes, int srcOffset, int maxLen, int& matchOff, int& matchLen) {
		auto& v = dict[hash(bytes + srcOffset)];

		matchOff = -1;
		matchLen = 2;

		for (int off : v) {
			int i = 0;
			if (off + maxLen > srcOffset) {
				// Unlikely, will wrap
				for (int off2 = off; i < maxLen; i++, off2++) {
					if (off2 >= srcOffset) {
						off2 = off;
					}
					if (bytes[off2] != bytes[srcOffset + i]) { break; }
				}
			} else {
				for (; i < maxLen; i++) {
					if (bytes[off + i] != bytes[srcOffset + i]) { break; }
				}
			}
			if (i > matchLen) {
				matchOff = off;
				matchLen = i;
				if (matchLen == maxLen) { break; }
			}
		}

		return matchLen > 2;
	}